

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * askYesOrNo_abi_cxx11_(void)

{
  char *pcVar1;
  ostream *poVar2;
  string *in_RDI;
  allocator local_21;
  
  std::__cxx11::string::string((string *)in_RDI,"abc",&local_21);
  while( true ) {
    pcVar1 = (char *)std::__cxx11::string::at((ulong)in_RDI);
    if (*pcVar1 == 'y') break;
    pcVar1 = (char *)std::__cxx11::string::at((ulong)in_RDI);
    if (*pcVar1 == 'n') break;
    std::operator>>((istream *)&std::cin,(string *)in_RDI);
    pcVar1 = (char *)std::__cxx11::string::at((ulong)in_RDI);
    if (*pcVar1 != 'y') {
      pcVar1 = (char *)std::__cxx11::string::at((ulong)in_RDI);
      if (*pcVar1 != 'n') {
        poVar2 = std::operator<<((ostream *)&std::cout,"Type y or n.");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Choice selected: ");
  pcVar1 = (char *)std::__cxx11::string::at((ulong)in_RDI);
  poVar2 = std::operator<<(poVar2,*pcVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  return in_RDI;
}

Assistant:

string askYesOrNo() {
    string answer = "abc";
    while (answer.at(0) != 'y' && answer.at(0) != 'n') {
        cin >> answer;
        if (answer.at(0) != 'y' && answer.at(0) != 'n') cout << "Type y or n." << endl;
    }
    cout << "Choice selected: " << answer.at(0) << endl;
    return answer;
}